

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O3

void __thiscall UnitTest_semantic10::UnitTest_semantic10(UnitTest_semantic10 *this)

{
  UnitTestBase::UnitTestBase(&this->super_UnitTestBase);
  (this->super_UnitTestBase)._vptr_UnitTestBase = (_func_int **)&PTR_Run_001863d8;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_UnitTestBase).test_name_,0,
             (char *)(this->super_UnitTestBase).test_name_._M_string_length,0x1674c9);
  return;
}

Assistant:

TEST_CASE(semantic10)
{
    EXPECT_TRUE(Semantic("a = 1 > 2"));
    EXPECT_TRUE(Semantic("a = 'str' >= 'str'"));
    EXPECT_TRUE(Semantic("a = 1 > b"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = 1 < 'str'");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = true <= false");
    });
}